

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLXWindow glfwGetGLXWindow(GLFWwindow *handle)

{
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (_glfw.platform.platformID != 0x60004) {
      format = "GLX: Platform not initialized";
      code = 0x1000e;
      goto LAB_0015c471;
    }
    if (*(int *)(handle + 0x20c) == 0x36001) {
      return *(GLXWindow *)(handle + 0x2c0);
    }
    code = 0x1000a;
  }
  format = (char *)0x0;
LAB_0015c471:
  _glfwInputError(code,format);
  return 0;
}

Assistant:

GLFWAPI GLXWindow glfwGetGLXWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "GLX: Platform not initialized");
        return None;
    }

    if (window->context.source != GLFW_NATIVE_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return None;
    }

    return window->context.glx.window;
}